

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

pair<int,_int> __thiscall imrt::Collimator::indexToPos(Collimator *this,int index,int angle)

{
  mapped_type *pmVar1;
  int in_ESI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *in_RDI;
  ptrdiff_t posy;
  ptrdiff_t posx;
  double y;
  double x;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  pair<long,_long> in_stack_ffffffffffffff78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff88;
  key_type_conflict *in_stack_ffffffffffffffa8;
  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  pair<int,_int> local_8;
  
  pmVar1 = std::
           map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
           ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator[]
            (pmVar1,(long)in_ESI);
  pmVar1 = std::
           map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
           ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator[]
            (pmVar1,(long)in_ESI);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
  std::find<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffff88,(double *)in_stack_ffffffffffffff78.second,
             (double *)in_stack_ffffffffffffff78.first);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
  __gnu_cxx::operator-
            (in_RDI,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    in_stack_ffffffffffffff68);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
  std::find<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffff88,(double *)in_stack_ffffffffffffff78.second,
             (double *)in_stack_ffffffffffffff78.first);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
  __gnu_cxx::operator-
            (in_RDI,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    in_stack_ffffffffffffff68);
  std::make_pair<long&,long&>((long *)in_RDI,(long *)in_stack_ffffffffffffff68);
  std::pair<int,_int>::pair<long,_long,_true>(&local_8,(pair<long,_long> *)&stack0xffffffffffffff78)
  ;
  return local_8;
}

Assistant:

pair<int,int> Collimator::indexToPos(int index, int angle){
    double x= angle_coord[angle][index].first;
    double y= angle_coord[angle][index].second;

    ptrdiff_t posx = find(xcoord.begin(), xcoord.end(), x) - xcoord.begin();
    ptrdiff_t posy = find(ycoord.begin(), ycoord.end(), y) - ycoord.begin();
    return(make_pair(posx, posy));
  }